

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

void __thiscall ON_SubD_FixedSizeHeap::Reset(ON_SubD_FixedSizeHeap *this)

{
  if ((ulong)this->m_h_capacity != 0) {
    memset(this->m_hash_table,0,(ulong)this->m_h_capacity << 3);
  }
  this->m_v_index = 0;
  this->m_e_index = 0;
  this->m_f_index = 0;
  this->m_p_index = 0;
  this->m_h_count = 0;
  return;
}

Assistant:

void ON_SubD_FixedSizeHeap::Reset()
{
  if (m_h_capacity > 0)
    memset(m_hash_table, 0, m_h_capacity * sizeof(*m_hash_table));
  m_v_index = 0;
  m_e_index = 0;
  m_f_index = 0;
  m_p_index = 0;
  m_h_count = 0;
}